

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O2

void __thiscall KDReports::Test::test4000SmallCells(Test *this)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  TableBreakingPageOrder TVar4;
  int iVar5;
  AutoTableElement *pAVar6;
  reference pQVar7;
  QDebug *this_00;
  int t;
  int iVar8;
  int iVar9;
  double dVar10;
  QLatin1String latin1;
  QArrayDataPointer<QRect> local_120;
  char *local_108;
  int local_fc;
  QArrayDataPointer<QRect> local_f8;
  Report report;
  QFont font;
  AutoTableElement tableElement;
  QRect local_90;
  QRect local_80;
  QRect local_70;
  QRect local_60;
  QRect local_50;
  QRect local_40;
  
  fillModel(this,0x28,100,true);
  KDReports::Report::Report(&report,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)&report);
  KDReports::AutoTableElement::AutoTableElement(&tableElement,(QAbstractItemModel *)&this->m_model);
  KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(&tableElement,0));
  KDReports::AbstractTableElement::setPadding(3.0);
  pAVar6 = (AutoTableElement *)KDReports::Report::mainTable();
  KDReports::MainTable::setAutoTableElement(pAVar6);
  latin1.m_data = "Arial";
  latin1.m_size = 5;
  QString::QString((QString *)&local_120,latin1);
  QFont::QFont(&font,(QString *)&local_120,-1,-1,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_120);
  QFont::setPixelSize((int)&font);
  KDReports::Report::setDefaultFont((QFont *)&report);
  KDReports::Report::scaleTo((int)&report,2);
  TVar4 = KDReports::Report::mainTable();
  KDReports::MainTable::setTableBreakingPageOrder(TVar4);
  iVar5 = KDReports::Report::numberOfPages();
  cVar2 = QTest::qCompare(iVar5,6,"report.numberOfPages()","6",
                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                          ,0x136);
  if (cVar2 != '\0') {
    local_120.d = (Data *)0x13a00000002;
    local_120.ptr = (QRect *)0x10b720;
    local_120.size = 0x10c320;
    local_108 = "default";
    QMessageLogger::debug();
    KDReports::Report::mainTable();
    dVar10 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
    QDebug::operator<<((QDebug *)&local_f8,dVar10);
    QDebug::~QDebug((QDebug *)&local_f8);
    KDReports::Report::mainTable();
    dVar10 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
    cVar2 = QTest::qVerify(0.45 <= dVar10,"report.mainTable()->lastAutoFontScalingFactor() >= 0.45",
                           "",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x141);
    if (cVar2 != '\0') {
      KDReports::Report::mainTable();
      dVar10 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
      cVar2 = QTest::qVerify(dVar10 <= 0.5,"report.mainTable()->lastAutoFontScalingFactor() <= 0.50"
                             ,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x142);
      if (cVar2 != '\0') {
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        pQVar7 = QList<QRect>::operator[]((QList<QRect> *)&local_120,0);
        iVar5 = pQVar7->y2 - pQVar7->y1;
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_120);
        local_120.d = (Data *)0x14500000002;
        local_120.ptr = (QRect *)0x10b720;
        local_120.size = 0x10c320;
        local_108 = "default";
        QMessageLogger::debug();
        t = iVar5 + 1;
        this_00 = QDebug::operator<<((QDebug *)&local_f8,t);
        QDebug::operator<<(this_00,"rows");
        QDebug::~QDebug((QDebug *)&local_f8);
        cVar2 = QTest::qVerify(0x24 < t,"rows >= 37","",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0x146);
        if (cVar2 != '\0') {
          cVar2 = QTest::qVerify(t < 0x31,"rows <= 48","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                 ,0x147);
          if (cVar2 != '\0') {
            KDReports::Report::mainTable();
            KDReports::MainTable::pageRects();
            pQVar7 = QList<QRect>::operator[]((QList<QRect> *)&local_120,0);
            iVar8 = pQVar7->x2 - pQVar7->x1;
            iVar9 = iVar8 + 1;
            QArrayDataPointer<QRect>::~QArrayDataPointer(&local_120);
            cVar2 = QTest::qVerify(0x13 < iVar9,"columns >= 20","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                   ,0x149);
            if (cVar2 != '\0') {
              cVar2 = QTest::qVerify(iVar9 < 0x16,"columns <= 21","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                     ,0x14a);
              if (cVar2 != '\0') {
                KDReports::Report::mainTable();
                KDReports::MainTable::pageRects();
                pQVar7 = QList<QRect>::operator[]((QList<QRect> *)&local_120,0);
                local_f8.d._0_4_ = 0;
                local_f8.d._4_4_ = 0;
                local_f8.ptr._0_4_ = iVar8;
                local_f8.ptr._4_4_ = iVar5;
                bVar3 = QTest::qCompare<QRect,QRect>
                                  (pQVar7,(QRect *)&local_f8,"report.mainTable()->pageRects()[0]",
                                   "QRect(0, 0, columns, rows)",
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                   ,0x14d);
                QArrayDataPointer<QRect>::~QArrayDataPointer(&local_120);
                if (bVar3) {
                  KDReports::Report::mainTable();
                  KDReports::MainTable::pageRects();
                  pQVar7 = QList<QRect>::operator[]((QList<QRect> *)&local_120,1);
                  local_f8.d._4_4_ = 0;
                  local_f8.ptr._0_4_ = 0x27;
                  local_f8.d._0_4_ = iVar9;
                  local_f8.ptr._4_4_ = iVar5;
                  bVar3 = QTest::qCompare<QRect,QRect>
                                    (pQVar7,(QRect *)&local_f8,"report.mainTable()->pageRects()[1]",
                                     "QRect(columns, 0, 40 - columns, rows)",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                     ,0x14e);
                  QArrayDataPointer<QRect>::~QArrayDataPointer(&local_120);
                  if (bVar3) {
                    KDReports::Report::mainTable();
                    KDReports::MainTable::pageRects();
                    pQVar7 = QList<QRect>::operator[]((QList<QRect> *)&local_120,2);
                    local_f8.d._0_4_ = 0;
                    iVar1 = iVar5 + t;
                    local_f8.d._4_4_ = t;
                    local_f8.ptr._0_4_ = iVar8;
                    local_f8.ptr._4_4_ = iVar1;
                    bVar3 = QTest::qCompare<QRect,QRect>
                                      (pQVar7,(QRect *)&local_f8,
                                       "report.mainTable()->pageRects()[2]",
                                       "QRect(0, rows, columns, rows)",
                                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                       ,0x14f);
                    QArrayDataPointer<QRect>::~QArrayDataPointer(&local_120);
                    if (bVar3) {
                      KDReports::Report::mainTable();
                      KDReports::MainTable::pageRects();
                      pQVar7 = QList<QRect>::operator[]((QList<QRect> *)&local_120,3);
                      local_f8.ptr._0_4_ = 0x27;
                      local_f8.d._0_4_ = iVar9;
                      local_f8.d._4_4_ = t;
                      local_f8.ptr._4_4_ = iVar1;
                      bVar3 = QTest::qCompare<QRect,QRect>
                                        (pQVar7,(QRect *)&local_f8,
                                         "report.mainTable()->pageRects()[3]",
                                         "QRect(columns, rows, 40 - columns, rows)",
                                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                         ,0x150);
                      QArrayDataPointer<QRect>::~QArrayDataPointer(&local_120);
                      if (bVar3) {
                        KDReports::Report::mainTable();
                        KDReports::MainTable::pageRects();
                        pQVar7 = QList<QRect>::operator[]((QList<QRect> *)&local_120,4);
                        local_f8.d._0_4_ = 0;
                        local_fc = t * 2;
                        local_f8.ptr._4_4_ = 99;
                        local_f8.d._4_4_ = local_fc;
                        local_f8.ptr._0_4_ = iVar8;
                        bVar3 = QTest::qCompare<QRect,QRect>
                                          (pQVar7,(QRect *)&local_f8,
                                           "report.mainTable()->pageRects()[4]",
                                           "QRect(0, 2 * rows, columns, 100 - 2 * rows)",
                                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                           ,0x151);
                        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_120);
                        if (bVar3) {
                          KDReports::Report::mainTable();
                          KDReports::MainTable::pageRects();
                          pQVar7 = QList<QRect>::operator[]((QList<QRect> *)&local_120,5);
                          local_f8.d._4_4_ = local_fc;
                          local_f8.ptr._0_4_ = 0x27;
                          local_f8.ptr._4_4_ = 99;
                          local_f8.d._0_4_ = iVar9;
                          bVar3 = QTest::qCompare<QRect,QRect>
                                            (pQVar7,(QRect *)&local_f8,
                                             "report.mainTable()->pageRects()[5]",
                                             "QRect(columns, 2 * rows, 40 - columns, 100 - 2 * rows)"
                                             ,
                                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                             ,0x152);
                          QArrayDataPointer<QRect>::~QArrayDataPointer(&local_120);
                          if (bVar3) {
                            KDReports::Report::setTableBreakingPageOrder
                                      ((TableBreakingPageOrder)&report);
                            KDReports::Report::mainTable();
                            KDReports::MainTable::pageRects();
                            local_f8.size = 0;
                            local_40.x1 = 0;
                            local_40.y1 = 0;
                            local_f8.d._0_4_ = 0;
                            local_f8.d._4_4_ = 0;
                            local_f8.ptr._0_4_ = 0;
                            local_f8.ptr._4_4_ = 0;
                            local_40.x2 = iVar8;
                            local_40.y2 = iVar5;
                            QList<QRect>::emplaceBack<QRect>((QList<QRect> *)&local_f8,&local_40);
                            local_50.x1 = 0;
                            local_50.y1 = t;
                            local_50.x2 = iVar8;
                            local_50.y2 = iVar1;
                            QList<QRect>::emplaceBack<QRect>((QList<QRect> *)&local_f8,&local_50);
                            local_60.x1 = 0;
                            local_60.y1 = local_fc;
                            local_60.y2 = 99;
                            local_60.x2 = iVar8;
                            QList<QRect>::emplaceBack<QRect>((QList<QRect> *)&local_f8,&local_60);
                            local_70.y1 = 0;
                            local_70.x2 = 0x27;
                            local_70.x1 = iVar9;
                            local_70.y2 = iVar5;
                            QList<QRect>::emplaceBack<QRect>((QList<QRect> *)&local_f8,&local_70);
                            local_80.x2 = 0x27;
                            local_80.x1 = iVar9;
                            local_80.y1 = t;
                            local_80.y2 = iVar1;
                            QList<QRect>::emplaceBack<QRect>((QList<QRect> *)&local_f8,&local_80);
                            local_90.y1 = local_fc;
                            local_90.x2 = 0x27;
                            local_90.y2 = 99;
                            local_90.x1 = iVar9;
                            QList<QRect>::emplaceBack<QRect>((QList<QRect> *)&local_f8,&local_90);
                            QTest::qCompare<QRect>
                                      ((QList<QRect> *)&local_120,(QList<QRect> *)&local_f8,
                                       "report.mainTable()->pageRects()",
                                       "QList<QRect>() << QRect(0, 0, columns, rows) << QRect(0, rows, columns, rows) << QRect(0, 2 * rows, columns, 100 - 2 * rows) << QRect(columns, 0, 40 - columns, rows) << QRect(columns, rows, 40 - columns, rows) << QRect(columns, 2 * rows, 40 - columns, 100 - 2 * rows)"
                                       ,
                                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                       ,0x158);
                            QArrayDataPointer<QRect>::~QArrayDataPointer(&local_f8);
                            QArrayDataPointer<QRect>::~QArrayDataPointer(&local_120);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  QFont::~QFont(&font);
  KDReports::AutoTableElement::~AutoTableElement(&tableElement);
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void test4000SmallCells()
    {
        fillModel(40, 100, true /*small cells*/);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        AutoTableElement tableElement(&m_model);
        tableElement.setVerticalHeaderVisible(false);
        tableElement.setPadding(3);
        report.mainTable()->setAutoTableElement(tableElement);
        QFont font(QLatin1String("Arial"));
        font.setPixelSize(19);
        report.setDefaultFont(font);
        report.scaleTo(2, 50);
        report.mainTable()->setTableBreakingPageOrder(Report::RightThenDown);
        QCOMPARE(report.numberOfPages(), 6);
        // With point size 10, initially I was getting 0.583037. With FontScaler: 0.524504.
        // With pixel sizes: 0.478, on both machines.
        // Autobuild on linux gets 37 rows instead of 43, though (taller font, by one pixel...)
        qDebug() << report.mainTable()->lastAutoFontScalingFactor();
#ifdef Q_OS_MAC
        // Bah, fonts change too much.
        return;
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() >= 0.37);
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() <= 0.39);
#else
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() >= 0.45);
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() <= 0.50);
#endif
        const int rows = report.mainTable()->pageRects()[0].height();
        qDebug() << rows << "rows";
        QVERIFY(rows >= 37);
        QVERIFY(rows <= 48);
        const int columns = report.mainTable()->pageRects()[0].width();
        QVERIFY(columns >= 20);
        QVERIFY(columns <= 21);

        // qDebug() << report.mainTable()->pageRects();
        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, columns, rows));
        QCOMPARE(report.mainTable()->pageRects()[1], QRect(columns, 0, 40 - columns, rows));
        QCOMPARE(report.mainTable()->pageRects()[2], QRect(0, rows, columns, rows));
        QCOMPARE(report.mainTable()->pageRects()[3], QRect(columns, rows, 40 - columns, rows));
        QCOMPARE(report.mainTable()->pageRects()[4], QRect(0, 2 * rows, columns, 100 - 2 * rows));
        QCOMPARE(report.mainTable()->pageRects()[5], QRect(columns, 2 * rows, 40 - columns, 100 - 2 * rows));

        report.setTableBreakingPageOrder(Report::DownThenRight);
        // qDebug() << report.mainTable()->pageRects();
        QCOMPARE(report.mainTable()->pageRects(),
                 QList<QRect>() << QRect(0, 0, columns, rows) << QRect(0, rows, columns, rows) << QRect(0, 2 * rows, columns, 100 - 2 * rows) << QRect(columns, 0, 40 - columns, rows)
                                << QRect(columns, rows, 40 - columns, rows) << QRect(columns, 2 * rows, 40 - columns, 100 - 2 * rows));
    }